

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  pointer ppVar6;
  TestError *pTVar7;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  GLdouble buffer_data_3 [16];
  GLuint buffer_data_2 [16];
  GLint buffer_data_1 [16];
  GLfloat buffer_data [16];
  undefined4 local_19c;
  GLint my_storage_block_index;
  GLuint buffer_object_id;
  GLint *local_178;
  string *vertex_shader_source;
  string **local_150;
  string *tess_eval_shader_source;
  string **local_128;
  string *tess_ctrl_shader_source;
  string **local_100;
  string *geometry_shader_source;
  string **local_d8;
  string *fragment_shader_source;
  string **local_b0;
  string *compute_shader_source;
  undefined1 local_98 [8];
  string uniform_use;
  string uniform_definition;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_40;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  size_t num_var_types;
  test_var_type *var_types_set;
  Functions *gl;
  TestShaderType tested_shader_type_local;
  InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
                      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.context_id);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x3 < var_iterator._M_node) {
      return;
    }
    local_48._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_gl + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_40,&local_48);
    uniform_definition.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_50,(iterator *)((long)&uniform_definition.field_2 + 8));
    bVar1 = std::operator!=(&local_40,&local_50);
    if (!bVar1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1d72);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::string((string *)(uniform_use.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_98);
    std::__cxx11::string::operator+=
              ((string *)(uniform_use.field_2._M_local_buf + 8),
               "layout (std140) buffer storage_block_name\n{\n");
    std::__cxx11::string::operator+=((string *)(uniform_use.field_2._M_local_buf + 8),"    ");
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_40);
    std::__cxx11::string::operator+=
              ((string *)(uniform_use.field_2._M_local_buf + 8),(string *)&ppVar6->second);
    std::__cxx11::string::operator+=
              ((string *)(uniform_use.field_2._M_local_buf + 8)," my_storage_1[1][1][1][1];\n};\n");
    std::__cxx11::string::operator=
              ((string *)local_98,"    float result = float(my_storage_1[0][0][0][0]);\n");
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_compute_shader
              ((string *)&fragment_shader_source,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_b0 = &fragment_shader_source;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_fragment_shader
              ((string *)&geometry_shader_source,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_d8 = &geometry_shader_source;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_geometry_shader
              ((string *)&tess_ctrl_shader_source,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_100 = &tess_ctrl_shader_source;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_ctrl_shader
              ((string *)&tess_eval_shader_source,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_128 = &tess_eval_shader_source;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_eval_shader
              ((string *)&vertex_shader_source,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_150 = &vertex_shader_source;
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_vertex_shader
              ((string *)&my_storage_block_index,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,(string *)((long)&uniform_use.field_2 + 8),(string *)local_98);
    local_178 = &my_storage_block_index;
    if (tested_shader_type < COMPUTE_SHADER_TYPE) {
      (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
        super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
        _vptr_TestNode[9])(this,local_178,local_d8,0);
    }
    else {
      if (3 < tested_shader_type - COMPUTE_SHADER_TYPE) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1d09);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
        super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,local_178,local_128,local_150,local_100,local_d8,local_b0,0,0);
    }
    std::__cxx11::string::~string((string *)&my_storage_block_index);
    std::__cxx11::string::~string((string *)&vertex_shader_source);
    std::__cxx11::string::~string((string *)&tess_eval_shader_source);
    std::__cxx11::string::~string((string *)&tess_ctrl_shader_source);
    std::__cxx11::string::~string((string *)&geometry_shader_source);
    std::__cxx11::string::~string((string *)&fragment_shader_source);
    local_19c = 0;
    (**(code **)(lVar5 + 0x1680))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.program_object_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d1b);
    iVar2 = (**(code **)(lVar5 + 0x9a8))
                      ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
                       super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.program_object_id,
                       0x92e6,"storage_block_name");
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetProgramResourceIndex() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d1f);
    if (iVar2 == -1) break;
    (**(code **)(lVar5 + 0x6c8))(1,&local_19c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d27);
    (**(code **)(lVar5 + 0x40))(0x90d2,local_19c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d2a);
    switch(var_iterator._M_node) {
    case (_Base_ptr)0x0:
      buffer_data_1[0xe] = 0;
      buffer_data_1[0xf] = 0x3f800000;
      (**(code **)(lVar5 + 0x150))(0x90d2,0x40,buffer_data_1 + 0xe,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1d34);
      break;
    case (_Base_ptr)0x1:
      buffer_data_1[10] = 0xc;
      buffer_data_1[0xb] = 0xd;
      buffer_data_1[0xc] = 0xe;
      buffer_data_1[0xd] = 0xf;
      buffer_data_1[6] = 8;
      buffer_data_1[7] = 9;
      buffer_data_1[8] = 10;
      buffer_data_1[9] = 0xb;
      buffer_data_1[2] = 4;
      buffer_data_1[3] = 5;
      buffer_data_1[4] = 6;
      buffer_data_1[5] = 7;
      buffer_data_2[0xe] = 0;
      buffer_data_2[0xf] = 1;
      buffer_data_1[0] = 2;
      buffer_data_1[1] = 3;
      (**(code **)(lVar5 + 0x150))(0x90d2,0x40,buffer_data_2 + 0xe,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1d3e);
      break;
    case (_Base_ptr)0x2:
      buffer_data_2[10] = 0xc;
      buffer_data_2[0xb] = 0xd;
      buffer_data_2[0xc] = 0xe;
      buffer_data_2[0xd] = 0xf;
      buffer_data_2[6] = 8;
      buffer_data_2[7] = 9;
      buffer_data_2[8] = 10;
      buffer_data_2[9] = 0xb;
      buffer_data_2[2] = 4;
      buffer_data_2[3] = 5;
      buffer_data_2[4] = 6;
      buffer_data_2[5] = 7;
      buffer_data_3[0xf]._0_4_ = 0;
      buffer_data_3[0xf]._4_4_ = 1;
      buffer_data_2[0] = 2;
      buffer_data_2[1] = 3;
      (**(code **)(lVar5 + 0x150))(0x90d2,0x40,buffer_data_3 + 0xf,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1d47);
      break;
    case (_Base_ptr)0x3:
      buffer_data_3[0xd] = 14.0;
      buffer_data_3[0xe] = 15.0;
      buffer_data_3[0xb] = 12.0;
      buffer_data_3[0xc] = 13.0;
      buffer_data_3[9] = 10.0;
      buffer_data_3[10] = 11.0;
      buffer_data_3[7] = 8.0;
      buffer_data_3[8] = 9.0;
      buffer_data_3[5] = 6.0;
      buffer_data_3[6] = 7.0;
      buffer_data_3[3] = 4.0;
      buffer_data_3[4] = 5.0;
      buffer_data_3[1] = 2.0;
      buffer_data_3[2] = 3.0;
      uStack_2e8 = 0;
      uStack_2e4 = 0;
      buffer_data_3[0]._0_4_ = 0;
      buffer_data_3[0]._4_4_ = 0x3ff00000;
      (**(code **)(lVar5 + 0x150))(0x90d2,0x80,&uStack_2e8,0x88e4);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBufferData() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x1d51);
      break;
    default:
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid variable-type index.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1d57);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar5 + 0x12c0))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.program_object_id,iVar2,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glUniformBlockBinding() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d5e);
    (**(code **)(lVar5 + 0x48))(0x90d2,0,local_19c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBufferBase() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d61);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this);
    }
    else {
      execute_draw_test(this,tested_shader_type);
    }
    (**(code **)(lVar5 + 0x438))(1,&local_19c);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)(uniform_use.field_2._M_local_buf + 8));
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Uniform block not found or is considered as not active.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1d23);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionStorageBuffers2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glw::Functions&		gl			  = this->context_id.getRenderContext().getFunctions();
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float / int / uint values. */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string uniform_definition;
			std::string uniform_use;

			uniform_definition += "layout (std140) buffer storage_block_name\n"
								  "{\n";
			uniform_definition += "    ";
			uniform_definition += var_iterator->second.type;
			uniform_definition += " my_storage_1[1][1][1][1];\n"
								  "};\n";

			uniform_use = "    float result = float(my_storage_1[0][0][0][0]);\n";

			if (API::USE_ALL_SHADER_STAGES)
			{
				const std::string& compute_shader_source =
					this->prepare_compute_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& geometry_shader_source =
					this->prepare_geometry_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_ctrl_shader_source =
					this->prepare_tess_ctrl_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_eval_shader_source =
					this->prepare_tess_eval_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				switch (tested_shader_type)
				{
				case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
					break;

				case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
												geometry_shader_source, fragment_shader_source, compute_shader_source,
												false, false);
					break;

				default:
					TCU_FAIL("Invalid enum");
					break;
				}
			}
			else
			{
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			}

			glw::GLuint buffer_object_id	   = 0;
			glw::GLint  my_storage_block_index = GL_INVALID_INDEX;

			gl.useProgram(this->program_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

			my_storage_block_index =
				gl.getProgramResourceIndex(this->program_object_id, GL_SHADER_STORAGE_BLOCK, "storage_block_name");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceIndex() failed.");

			if ((unsigned)my_storage_block_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Uniform block not found or is considered as not active.");
			}

			gl.genBuffers(1, &buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

			switch (var_type_index)
			{
			case 0: //float type of uniform is considered
			{
				glw::GLfloat buffer_data[] = { 0.0f, 1.0f, 2.0f,  3.0f,  4.0f,  5.0f,  6.0f,  7.0f,
											   8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f };

				gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* float case */
			case 1: //int type of uniform is considered
			{

				glw::GLint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* int case */
			case 2: //uint type of uniform is considered
			{
				glw::GLuint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* uint case */
			case 3: //double type of uniform is considered
			{
				glw::GLdouble buffer_data[] = { 0.0, 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,
												8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

				gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			} /* double case */
			default:
			{
				TCU_FAIL("Invalid variable-type index.");

				break;
			}
			} /* switch (var_type_index) */

			gl.shaderStorageBlockBinding(this->program_object_id, my_storage_block_index, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformBlockBinding() failed.");

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

			if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
			{
				execute_draw_test(tested_shader_type);
			}
			else
			{
				execute_dispatch_test();
			}

			/* Deallocate any resources used. */
			gl.deleteBuffers(1, &buffer_object_id);
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}